

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O2

void compute_best_interintra_mode
               (AV1_COMP *cpi,MB_MODE_INFO *mbmi,MACROBLOCKD *xd,MACROBLOCK *x,
               int *interintra_mode_cost,BUFFER_SET *orig_dst,uint8_t *intrapred,uint8_t *tmp_buf,
               INTERINTRA_MODE *best_interintra_mode,int64_t *best_interintra_rd,
               INTERINTRA_MODE interintra_mode,BLOCK_SIZE bsize)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  uint8_t skip_txfm_sb;
  int rate;
  int64_t skip_sse_sb;
  int64_t dist;
  int64_t *in_stack_ffffffffffffffa8;
  int local_44;
  uint8_t local_40 [8];
  long local_38;
  
  bVar1 = (byte)((AV1_COMP *)(ulong)bsize)[7].mv_search_params.search_site_cfg[1][6].site[0xc][0].mv
                .row;
  mbmi->interintra_mode = interintra_mode;
  iVar2 = interintra_mode_cost[interintra_mode];
  av1_build_intra_predictors_for_interintra(&cpi->common,xd,bsize,0,orig_dst,intrapred,(uint)bVar1);
  av1_combine_interintra(xd,bsize,0,tmp_buf,(uint)bVar1,intrapred,(uint)bVar1);
  model_rd_for_sb_with_curvfit
            ((AV1_COMP *)(ulong)bsize,(BLOCK_SIZE)x,(MACROBLOCK *)xd,(MACROBLOCKD *)0x0,0,
             (int)&local_44,(int *)&local_38,(int64_t *)&stack0xffffffffffffffaf,local_40,
             (int64_t *)0x0,(int *)0x0,(int64_t *)0x0,in_stack_ffffffffffffffa8);
  lVar3 = local_38 * 0x80 + ((long)x->rdmult * ((long)local_44 + (long)iVar2) + 0x100 >> 9);
  if (lVar3 < *best_interintra_rd) {
    *best_interintra_rd = lVar3;
    *best_interintra_mode = mbmi->interintra_mode;
  }
  return;
}

Assistant:

static inline void compute_best_interintra_mode(
    const AV1_COMP *const cpi, MB_MODE_INFO *mbmi, MACROBLOCKD *xd,
    MACROBLOCK *const x, const int *const interintra_mode_cost,
    const BUFFER_SET *orig_dst, uint8_t *intrapred, const uint8_t *tmp_buf,
    INTERINTRA_MODE *best_interintra_mode, int64_t *best_interintra_rd,
    INTERINTRA_MODE interintra_mode, BLOCK_SIZE bsize) {
  const AV1_COMMON *const cm = &cpi->common;
  int rate;
  uint8_t skip_txfm_sb;
  int64_t dist, skip_sse_sb;
  const int bw = block_size_wide[bsize];
  mbmi->interintra_mode = interintra_mode;
  int rmode = interintra_mode_cost[interintra_mode];
  av1_build_intra_predictors_for_interintra(cm, xd, bsize, 0, orig_dst,
                                            intrapred, bw);
  av1_combine_interintra(xd, bsize, 0, tmp_buf, bw, intrapred, bw);
  model_rd_sb_fn[MODELRD_TYPE_INTERINTRA](cpi, bsize, x, xd, 0, 0, &rate, &dist,
                                          &skip_txfm_sb, &skip_sse_sb, NULL,
                                          NULL, NULL);
  int64_t rd = RDCOST(x->rdmult, rate + rmode, dist);
  if (rd < *best_interintra_rd) {
    *best_interintra_rd = rd;
    *best_interintra_mode = mbmi->interintra_mode;
  }
}